

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

void w256_to_bitstream(bitstream_t *bs,word256 v,size_t width,size_t size)

{
  uint64_t *puVar1;
  uint64_t auStack_88 [12];
  
  puVar1 = auStack_88 + width;
  auStack_88[0] = 0x40;
  for (; 0x3f < size; size = size - 0x40) {
    auStack_88[0] = 0x11d849;
    bitstream_put_bits(bs,*puVar1,0x40);
    puVar1 = puVar1 + -1;
  }
  if (size != 0) {
    auStack_88[0] = 0x11d86f;
    bitstream_put_bits(bs,*puVar1 >> ((ulong)(byte)-(char)size & 0x3f),(uint)size);
  }
  return;
}

Assistant:

ATTR_TARGET_S256
static inline void w256_to_bitstream(bitstream_t* bs, const word256 v, const size_t width,
                                     const size_t size) {
  ATTR_ALIGNED(32) uint64_t buf[4];
  mm256_store(buf, v);

  const uint64_t* d = &buf[width - 1];
  size_t bits       = size;
  for (; bits >= sizeof(uint64_t) * 8; bits -= sizeof(uint64_t) * 8, --d) {
    bitstream_put_bits(bs, *d, sizeof(uint64_t) * 8);
  }
  if (bits) {
    bitstream_put_bits(bs, *d >> (sizeof(uint64_t) * 8 - bits), bits);
  }
}